

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O3

void ui_entry_insert(ui_entry *entry)

{
  ui_entry **ppuVar1;
  wchar_t wVar2;
  undefined8 in_RAX;
  ui_entry **__dest;
  long lVar3;
  wchar_t ind;
  wchar_t local_24;
  
  local_24 = (wchar_t)((ulong)in_RAX >> 0x20);
  wVar2 = ui_entry_search(entry->name,&local_24);
  if (wVar2 != L'\0') {
    quit("Attempted to insert ui_entry with same name");
  }
  ppuVar1 = entries;
  if (n_entry == nalloc_entry) {
    wVar2 = n_entry;
    if (L'\x3fffffff' < n_entry) {
      quit("Too many ui_entry");
      wVar2 = nalloc_entry;
    }
    nalloc_entry = L'\b';
    if (wVar2 != L'\0') {
      nalloc_entry = wVar2 * 2;
    }
    __dest = (ui_entry **)mem_alloc((long)nalloc_entry << 3);
    ppuVar1 = entries;
    lVar3 = (long)local_24;
    if (0 < lVar3) {
      memcpy(__dest,entries,lVar3 * 8);
    }
    __dest[lVar3] = entry;
    if (local_24 < n_entry) {
      memcpy(__dest + lVar3 + 1,ppuVar1 + lVar3,(long)(n_entry - local_24) << 3);
    }
    mem_free(ppuVar1);
    entries = __dest;
  }
  else {
    if (local_24 < n_entry) {
      lVar3 = (long)n_entry;
      do {
        ppuVar1[lVar3] = ppuVar1[lVar3 + -1];
        lVar3 = lVar3 + -1;
      } while (local_24 < lVar3);
    }
    ppuVar1[local_24] = entry;
  }
  n_entry = n_entry + L'\x01';
  return;
}

Assistant:

static void ui_entry_insert(struct ui_entry *entry)
{
	int ind;

	if (ui_entry_search(entry->name, &ind)) {
		quit("Attempted to insert ui_entry with same name");
	}

	if (n_entry == nalloc_entry) {
		struct ui_entry **extended;

		if (nalloc_entry > INT_MAX / 2) {
			quit("Too many ui_entry");
		}
		nalloc_entry = (nalloc_entry == 0) ? 8 : 2 * nalloc_entry;
		extended = mem_alloc(nalloc_entry * sizeof(*extended));
		if (ind > 0) {
			(void) memcpy(extended, entries,
				ind * sizeof(*entries));
		}
		extended[ind] = entry;
		if (ind < n_entry) {
			(void) memcpy(extended + ind + 1, entries + ind,
				(n_entry - ind) * sizeof(*entries));
		}
		mem_free(entries);
		entries = extended;
	} else {
		int i;

		for (i = n_entry; i > ind; --i) {
			entries[i] = entries[i - 1];
		}
		entries[ind] = entry;
	}
	++n_entry;
}